

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

int main(void)

{
  char cVar1;
  ostream *poVar2;
  int iVar3;
  int local_5c0;
  allocator local_5b9;
  _InputArray local_5b8;
  int local_59c;
  __shared_ptr<cv::BackgroundSubtractor,_(__gnu_cxx::_Lock_policy)2> local_598;
  __shared_ptr<cv::BackgroundSubtractor,_(__gnu_cxx::_Lock_policy)2> local_588;
  undefined4 local_578;
  undefined4 uStack_574;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_570;
  pointer local_568;
  VideoCapture cap;
  double local_4e8;
  double dStack_4e0;
  double local_4d8;
  double dStack_4d0;
  double local_4c8;
  double dStack_4c0;
  double local_4b8;
  double dStack_4b0;
  undefined4 local_4a8;
  undefined4 uStack_4a4;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  pointer local_498;
  pointer pvStack_490;
  Mat mask;
  Mat imgYCrCb;
  Mat img;
  Mat frame;
  Matx<double,_4,_1> local_308;
  Scalar local_2e8;
  Mat local_2c8 [96];
  Mat local_268 [96];
  Mat blur;
  HandDetector hd;
  Mat local_90 [96];
  
  HandDetector::HandDetector(&hd);
  cv::VideoCapture::VideoCapture(&cap,0,0);
  cVar1 = cv::VideoCapture::isOpened();
  if (cVar1 == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Cannot open video capture");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar3 = 1;
  }
  else {
    cv::Mat::Mat(&frame);
    cv::Mat::Mat(&img);
    cv::Mat::Mat(&blur);
    cv::Mat::Mat(&imgYCrCb);
    cv::Mat::Mat(&mask);
    cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&stack0xfffffffffffffb58);
    local_4a8 = 0;
    uStack_4a4 = 0;
    uStack_4a0 = 0;
    uStack_49c = 0x4060e000;
    local_498 = (pointer)0x4056800000000000;
    pvStack_490 = (pointer)0x0;
    cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&stack0xfffffffffffffb38);
    local_4c8 = 255.0;
    dStack_4c0 = 230.0;
    local_4b8 = 150.0;
    dStack_4b0 = 0.0;
    cv::createBackgroundSubtractorMOG2((int)&stack0xfffffffffffffa88,16.0,true);
    local_598._M_ptr = (element_type *)_local_578;
    local_598._M_refcount._M_pi = _Stack_570._M_pi;
    _local_578 = (pointer)0x0;
    _Stack_570._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xfffffffffffffa90);
    iVar3 = 100;
    local_5c0 = 1;
    while( true ) {
      cVar1 = cv::VideoCapture::isOpened();
      if (cVar1 == '\0') break;
      cv::VideoCapture::operator>>(&cap,&frame);
      local_568 = (pointer)0x0;
      local_5b8.sz.width = 0;
      local_5b8.sz.height = 0;
      local_578 = 0x1010000;
      local_5b8.flags = 0x2010000;
      local_5b8.obj = &frame;
      _Stack_570._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&frame;
      cv::flip((_InputArray *)&stack0xfffffffffffffa88,(_OutputArray *)&local_5b8,0);
      local_568 = (pointer)0x0;
      local_5b8.sz.width = 0;
      local_5b8.sz.height = 0;
      local_578 = 0x1010000;
      local_5b8.flags = 0x2010000;
      local_5b8.obj = &frame;
      _Stack_570._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&frame;
      cv::flip((_InputArray *)&stack0xfffffffffffffa88,(_OutputArray *)&local_5b8,1);
      cv::Mat::Mat(local_268,&frame);
      local_59c = iVar3;
      std::__shared_ptr<cv::BackgroundSubtractor,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_588,&local_598);
      iVar3 = local_5c0;
      deleteBg(local_90,local_268,(Ptr<cv::BackgroundSubtractor> *)&img,SUB81(&local_588,0),
               local_5c0);
      cv::Mat::~Mat(local_90);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_588._M_refcount);
      cv::Mat::~Mat(local_268);
      local_568 = (pointer)0x0;
      local_5b8.sz.width = 0;
      local_5b8.sz.height = 0;
      _local_578 = (pointer)CONCAT44(uStack_574,0x1010000);
      local_5b8.flags = 0x2010000;
      local_5b8.obj = &imgYCrCb;
      _Stack_570._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&img;
      cv::cvtColor((cv *)&stack0xfffffffffffffa88,&local_5b8,(_OutputArray *)0x24,0,iVar3);
      cv::Mat::Mat(local_2c8,&imgYCrCb);
      cv::Matx<double,_4,_1>::Matx
                ((Matx<double,_4,_1> *)&local_2e8,(double *)&stack0xfffffffffffffb58);
      cv::Matx<double,_4,_1>::Matx(&local_308,&stack0xfffffffffffffb38);
      HandDetector::detectHands_range
                ((HandDetector *)&stack0xfffffffffffffa88,(Mat *)&hd,(Scalar *)local_2c8,&local_2e8)
      ;
      cv::Mat::operator=(&mask,(Mat *)&stack0xfffffffffffffa88);
      cv::Mat::~Mat((Mat *)&stack0xfffffffffffffa88);
      cv::Mat::~Mat(local_2c8);
      HandDetector::getFingers(&hd);
      HandDetector::initFilters(&hd);
      HandDetector::updateFilters(&hd);
      HandDetector::stabilize(&hd);
      HandDetector::getHigherFingers(&hd);
      HandDetector::getFarthestFingers(&hd);
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&stack0xfffffffffffffb18);
      iVar3 = local_59c;
      local_4e8 = 255.0;
      dStack_4e0 = 0.0;
      local_4d8 = 100.0;
      dStack_4d0 = 0.0;
      HandDetector::drawHands(&hd,&frame,(Scalar *)&stack0xfffffffffffffb18,2);
      std::__cxx11::string::string((string *)&stack0xfffffffffffffa88,"hands",&local_5b9);
      local_5b8.sz.width = 0;
      local_5b8.sz.height = 0;
      local_5b8.flags = 0x1010000;
      local_5b8.obj = &frame;
      cv::imshow((string *)&stack0xfffffffffffffa88,&local_5b8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffa88);
      std::__cxx11::string::string((string *)&stack0xfffffffffffffa88,"mask",&local_5b9);
      local_5b8.sz.width = 0;
      local_5b8.sz.height = 0;
      local_5b8.flags = 0x1010000;
      local_5b8.obj = &mask;
      cv::imshow((string *)&stack0xfffffffffffffa88,&local_5b8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffa88);
      HandDetector::updateLast(&hd);
      if (iVar3 < 1) {
        if (local_5c0 != 0) {
          poVar2 = std::operator<<((ostream *)&std::cout,"Background learned");
          std::endl<char,std::char_traits<char>>(poVar2);
        }
        local_5c0 = 0;
      }
      else {
        iVar3 = iVar3 + -1;
      }
      cVar1 = cv::waitKey(1);
      if (cVar1 != -1) {
        if (cVar1 == 'b') {
          poVar2 = std::operator<<((ostream *)&std::cout,"Starting learning background.");
          std::endl<char,std::char_traits<char>>(poVar2);
          local_5c0 = 1;
          iVar3 = 100;
        }
        else {
          if (cVar1 == 'q') {
            poVar2 = std::operator<<((ostream *)&std::cout,"exit");
            std::endl<char,std::char_traits<char>>(poVar2);
            break;
          }
          printf("Key pressed: %c\n");
        }
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_598._M_refcount);
    cv::Mat::~Mat(&mask);
    cv::Mat::~Mat(&imgYCrCb);
    cv::Mat::~Mat(&blur);
    cv::Mat::~Mat(&img);
    cv::Mat::~Mat(&frame);
    iVar3 = 0;
  }
  cv::VideoCapture::~VideoCapture(&cap);
  HandDetector::~HandDetector(&hd);
  return iVar3;
}

Assistant:

int main()
{
    HandDetector hd;
    VideoCapture cap(0);
    if (!cap.isOpened()) {
        cerr << "Cannot open video capture" << endl;
        return EXIT_FAILURE;
    }

    Mat frame, img, blur, imgYCrCb, mask;

    Scalar lower = Scalar(0, 135, 90);
    Scalar upper = Scalar(255, 230, 150);

    Ptr<BackgroundSubtractor> bgs = createBackgroundSubtractorMOG2();
    bool bgs_learn = true;
    int bgs_learnNFrames = 100;

    while (cap.isOpened()) {
        cap >> frame;
        flip(frame, frame, 0);
        flip(frame, frame, 1);

        deleteBg(frame, img, bgs, bgs_learn, hd.thresh_sens_val);
        cvtColor(img, imgYCrCb, COLOR_BGR2YCrCb);
        mask = hd.detectHands_range(imgYCrCb, lower, upper);
        hd.getFingers();

        hd.initFilters();
        hd.updateFilters();
        hd.stabilize();

        hd.getHigherFingers();
        hd.getFarthestFingers();

        hd.drawHands(frame, Scalar(255, 0, 100), 2);

        imshow("hands", frame);
        imshow("mask", mask);

        hd.updateLast();

        if (bgs_learnNFrames > 0)
            bgs_learnNFrames--;
        else if (bgs_learn) {
            bgs_learn = false;
            cout << "Background learned" << endl;
        }

        char key = waitKey(1);
        if (key != -1) {
            switch (key) {
                case 'q': // exit
                    cout << "exit" << endl;
                    return EXIT_SUCCESS;
                case 'b': // change bg
                    bgs_learnNFrames = 100;
                    bgs_learn = true;
                    cout << "Starting learning background." << endl;
                    break;
                default:
                    printf("Key pressed: %c\n", key);
                    break;
            }
        }
    }
    return EXIT_SUCCESS;
}